

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBreak(TranslateToFuzzReader *this,Type type)

{
  Name name_00;
  bool bVar1;
  value_type *ppEVar2;
  Expression *pEVar3;
  size_type sVar4;
  reference ppEVar5;
  Break *pBVar6;
  int iVar7;
  BasicType local_e4;
  uintptr_t local_e0;
  size_t local_d8;
  Loop *local_d0;
  Loop *loop;
  Expression *item;
  long lStack_b8;
  int i;
  size_t conditions;
  uintptr_t local_a8;
  size_t local_a0;
  Break *local_98;
  Break *ret_1;
  TranslateToFuzzReader *local_88;
  size_t local_80;
  char *local_78;
  Break *local_70;
  Break *ret;
  Type valueType;
  Name name;
  Expression *target;
  value_type pEStack_40;
  int tries;
  BasicType local_34;
  Expression *local_30;
  Expression *condition;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    (&this->funcContext->breakableStack);
  if (bVar1) {
    condition = (Expression *)this_local;
    pEVar3 = makeTrivial(this,(Type)this_local);
    return pEVar3;
  }
  local_30 = (Expression *)0x0;
  local_34 = unreachable;
  bVar1 = Type::operator!=((Type *)&this_local,&local_34);
  if (bVar1) {
    pEStack_40 = (value_type)0x0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&this->funcContext->hangStack,&stack0xffffffffffffffc0);
    local_30 = makeCondition(this);
  }
  target._4_4_ = (this->fuzzParams->super_FuzzParams).TRIES;
LAB_001e586e:
  do {
    do {
      while( true ) {
        while( true ) {
          iVar7 = target._4_4_ + -1;
          if (target._4_4_ < 1) {
            local_e4 = unreachable;
            bVar1 = Type::operator!=((Type *)&this_local,&local_e4);
            if (bVar1) {
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
                        (&this->funcContext->hangStack);
            }
            pEVar3 = makeTrivial(this,(Type)this_local);
            return pEVar3;
          }
          ppEVar2 = pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                              (this,&this->funcContext->breakableStack);
          pEVar3 = *ppEVar2;
          _valueType = (string_view)getTargetName(this,pEVar3);
          ret = (Break *)getTargetType(this,pEVar3);
          bVar1 = Type::isConcrete((Type *)&this_local);
          target._4_4_ = iVar7;
          if (!bVar1) break;
          bVar1 = Type::operator!=((Type *)&ret,(Type *)&this_local);
          if (!bVar1) {
            local_80 = valueType.id;
            local_78 = (char *)name.super_IString.str._M_len;
            local_88 = this_local;
            pEVar3 = make(this,(Type)this_local);
            name_00.super_IString.str._M_str = local_78;
            name_00.super_IString.str._M_len = local_80;
            local_70 = Builder::makeBreak(&this->builder,name_00,pEVar3,local_30);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
                      (&this->funcContext->hangStack);
            return (Expression *)local_70;
          }
        }
        ret_1._4_4_ = 0;
        bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ret_1 + 4));
        if (!bVar1) break;
        ret_1._0_4_ = 0;
        bVar1 = Type::operator!=((Type *)&ret,(BasicType *)&ret_1);
        if (!bVar1) {
          local_a8 = valueType.id;
          local_a0 = name.super_IString.str._M_len;
          local_98 = Builder::makeBreak(&this->builder,(Name)_valueType,(Expression *)0x0,local_30);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
                    (&this->funcContext->hangStack);
          return (Expression *)local_98;
        }
      }
      conditions._4_4_ = 1;
      bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&conditions + 4));
      if (!bVar1) {
        __assert_fail("type == Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xa03,"Expression *wasm::TranslateToFuzzReader::makeBreak(Type)");
      }
      conditions._0_4_ = 0;
      bVar1 = Type::operator!=((Type *)&ret,(BasicType *)&conditions);
    } while (bVar1);
    lStack_b8 = 0;
    sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      (&this->funcContext->hangStack);
    item._4_4_ = (int)sVar4;
    do {
      while( true ) {
        item._4_4_ = item._4_4_ + -1;
        if (item._4_4_ < 0) goto LAB_001e5b55;
        ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            (&this->funcContext->hangStack,(long)item._4_4_);
        loop = (Loop *)*ppEVar5;
        if (loop != (Loop *)0x0) break;
        lStack_b8 = lStack_b8 + 1;
      }
      local_d0 = Expression::cast<wasm::Loop>((Expression *)loop);
    } while ((local_d0 == (Loop *)0x0) ||
            (bVar1 = IString::operator==(&(local_d0->name).super_IString,(IString *)&valueType),
            !bVar1));
LAB_001e5b55:
    if (lStack_b8 == 0) {
      bVar1 = oneIn(this,4);
joined_r0x001e5b8c:
      if (bVar1) goto LAB_001e5bd7;
      goto LAB_001e586e;
    }
    if (lStack_b8 == 1) {
      bVar1 = oneIn(this,2);
      goto joined_r0x001e5b8c;
    }
    bVar1 = oneIn(this,(int)lStack_b8 + 1);
    if (!bVar1) {
LAB_001e5bd7:
      local_e0 = valueType.id;
      local_d8 = name.super_IString.str._M_len;
      pBVar6 = Builder::makeBreak(&this->builder,(Name)_valueType,(Expression *)0x0,
                                  (Expression *)0x0);
      return (Expression *)pBVar6;
    }
  } while( true );
}

Assistant:

Expression* TranslateToFuzzReader::makeBreak(Type type) {
  if (funcContext->breakableStack.empty()) {
    return makeTrivial(type);
  }
  Expression* condition = nullptr;
  if (type != Type::unreachable) {
    funcContext->hangStack.push_back(nullptr);
    condition = makeCondition();
  }
  // we need to find a proper target to break to; try a few times
  int tries = fuzzParams->TRIES;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto valueType = getTargetType(target);
    if (type.isConcrete()) {
      // we are flowing out a value
      if (valueType != type) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, make(type), condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else if (type == Type::none) {
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      auto* ret = builder.makeBreak(name, nullptr, condition);
      funcContext->hangStack.pop_back();
      return ret;
    } else {
      assert(type == Type::unreachable);
      if (valueType != Type::none) {
        // we need to break to a proper place
        continue;
      }
      // we are about to make an *un*conditional break. if it is
      // to a loop, we prefer there to be a condition along the
      // way, to reduce the chance of infinite looping
      size_t conditions = 0;
      int i = funcContext->hangStack.size();
      while (--i >= 0) {
        auto* item = funcContext->hangStack[i];
        if (item == nullptr) {
          conditions++;
        } else if (auto* loop = item->cast<Loop>()) {
          if (loop->name == name) {
            // we found the target, no more conditions matter
            break;
          }
        }
      }
      switch (conditions) {
        case 0: {
          if (!oneIn(4)) {
            continue;
          }
          break;
        }
        case 1: {
          if (!oneIn(2)) {
            continue;
          }
          break;
        }
        default: {
          if (oneIn(conditions + 1)) {
            continue;
          }
        }
      }
      return builder.makeBreak(name);
    }
  }
  // we failed to find something
  if (type != Type::unreachable) {
    funcContext->hangStack.pop_back();
  }
  return makeTrivial(type);
}